

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall pybind11::error_already_set::error_already_set(error_already_set *this)

{
  string local_30 [32];
  error_already_set *local_10;
  error_already_set *this_local;
  
  local_10 = this;
  detail::error_string_abi_cxx11_();
  std::runtime_error::runtime_error(&this->super_runtime_error,local_30);
  std::__cxx11::string::~string(local_30);
  *(undefined ***)this = &PTR__error_already_set_00134820;
  PyErr_Fetch(&this->type,&this->value,&this->trace);
  return;
}

Assistant:

error_already_set() : std::runtime_error(detail::error_string()) {
        PyErr_Fetch(&type, &value, &trace);
    }